

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O3

long coda_c_index_to_fortran_index(int num_dims,long *dim,long index)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  long d [8];
  long local_48 [9];
  
  if (num_dims < 9) {
    if (0 < num_dims) {
      uVar3 = (ulong)(num_dims - 1);
      do {
        lVar1 = dim[uVar3];
        local_48[uVar3] = index % lVar1;
        bVar4 = uVar3 != 0;
        uVar3 = uVar3 - 1;
        index = index / lVar1;
      } while (bVar4);
      if (0 < num_dims) {
        lVar2 = 1;
        lVar1 = 0;
        uVar3 = 0;
        do {
          lVar1 = lVar1 + local_48[uVar3] * lVar2;
          lVar2 = lVar2 * dim[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)num_dims != uVar3);
        return lVar1;
      }
    }
    lVar1 = 0;
  }
  else {
    coda_set_error(-100,"num_dims argument (%d) exceeds limit (%d)",(ulong)(uint)num_dims,8);
    lVar1 = -1;
  }
  return lVar1;
}

Assistant:

LIBCODA_API long coda_c_index_to_fortran_index(int num_dims, const long dim[], long index)
{
    long i, indexf, multiplier, d[CODA_MAX_NUM_DIMS];

    if (num_dims > CODA_MAX_NUM_DIMS)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "num_dims argument (%d) exceeds limit (%d)", num_dims,
                       CODA_MAX_NUM_DIMS);
        return -1;
    }

    for (i = num_dims - 1; i >= 0; i--)
    {
        d[i] = index % dim[i];
        index /= dim[i];
    }

    indexf = 0;
    multiplier = 1;

    for (i = 0; i < num_dims; i++)
    {
        indexf += multiplier * d[i];
        multiplier *= dim[i];
    }

    return indexf;
}